

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptReflect.cpp
# Opt level: O2

Var Js::JavascriptReflect::EntryConstruct(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  RecyclableObject *instanceVar;
  RecyclableObject *pRVar6;
  RecyclableObject *aValue;
  Var pvVar7;
  RecyclableObject *this;
  Type typeId;
  int in_stack_00000010;
  undefined1 local_80 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  undefined1 local_48 [8];
  ArgumentReader args;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x172,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) goto LAB_00bae267;
    *puVar4 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)local_48,(CallInfo *)&__tag.entry.next,(Var *)&stack0x00000018);
  args.super_Arguments.Values =
       (Type)(((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
  aValue = (((((ScriptContext *)args.super_Arguments.Values)->super_ScriptContextBase).
            javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_80,function,(CallInfo)__tag.entry.next,
             L"Reflect.construct",&stack0x00000000);
  if ((local_48._0_4_ & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x177,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar2) goto LAB_00bae267;
    *puVar4 = 0;
  }
  if (((uint)local_48._0_4_ >> 0x18 & 1) != 0) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)args.super_Arguments.Values,-0x7ff5ebf5,L"Reflect.construct");
  }
  pRVar5 = aValue;
  if ((local_48._0_4_ & 0xfffffe) != 0) {
    pRVar5 = (RecyclableObject *)Arguments::operator[]((Arguments *)local_48,1);
  }
  bVar2 = JavascriptOperators::IsConstructor(pRVar5);
  if (!bVar2) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)args.super_Arguments.Values,-0x7ff5ea05,L"target");
  }
  instanceVar = pRVar5;
  if ((local_48._0_4_ & 0xfffffc) != 0) {
    instanceVar = (RecyclableObject *)Arguments::operator[]((Arguments *)local_48,3);
    bVar2 = JavascriptOperators::IsConstructor(instanceVar);
    if (!bVar2) {
      JavascriptError::ThrowTypeError
                ((ScriptContext *)args.super_Arguments.Values,-0x7ff5ea05,L"newTarget");
    }
  }
  pRVar6 = VarTo<Js::RecyclableObject>(aValue);
  if (instanceVar != (RecyclableObject *)0x0) {
    pRVar6 = VarTo<Js::RecyclableObject>(instanceVar);
    pRVar6 = JavascriptOperators::CreateFromConstructor
                       (pRVar6,(ScriptContext *)args.super_Arguments.Values);
  }
  if (2 < (local_48._0_4_ & 0xffffff)) {
    aValue = (RecyclableObject *)Arguments::operator[]((Arguments *)local_48,2);
  }
  if (aValue == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x199,"(argArray != nullptr)","argArray != nullptr");
    if (!bVar2) goto LAB_00bae267;
    *puVar4 = 0;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00bae267;
    *puVar4 = 0;
  }
  bVar2 = TaggedInt::Is(aValue);
  if (bVar2) {
    typeId = TypeIds_FirstNumberType;
  }
  else {
    if ((ulong)aValue >> 0x32 != 0) {
      typeId = TypeIds_Number;
      goto LAB_00bae150;
    }
    this = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00bae267;
      *puVar4 = 0;
    }
    typeId = ((this->type).ptr)->typeId;
    if ((0x57 < (int)typeId) && (BVar3 = RecyclableObject::IsExternal(this), BVar3 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_00bae267:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
LAB_00bae150:
  BVar3 = JavascriptOperators::IsObjectType(typeId);
  if (BVar3 == 0) {
    JavascriptError::ThrowTypeError
              ((ScriptContext *)args.super_Arguments.Values,-0x7ff5e9dc,L"Reflect.construct");
  }
  pRVar5 = VarTo<Js::RecyclableObject>(pRVar5);
  pvVar7 = JavascriptFunction::ConstructHelper
                     (pRVar5,pRVar6,instanceVar,aValue,(ScriptContext *)args.super_Arguments.Values)
  ;
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_80);
  return pvVar7;
}

Assistant:

Var JavascriptReflect::EntryConstruct(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Reflect.construct"));

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        if (args.Info.Flags & CallFlags_New)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ErrorOnNew, _u("Reflect.construct"));
        }

        Var target = args.Info.Count > 1 ? args[1] : undefinedValue;

        if (!JavascriptOperators::IsConstructor(target))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedConstructor, _u("target"));
        }

        Var newTarget = nullptr;
        if (args.Info.Count > 3)
        {
            newTarget = args[3];
            if (!JavascriptOperators::IsConstructor(newTarget))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedConstructor, _u("newTarget"));
            }
        }
        else
        {
            newTarget = target;
        }

        RecyclableObject* thisArg = VarTo<RecyclableObject>(undefinedValue);
        if (newTarget != nullptr)
        {
            thisArg = JavascriptOperators::CreateFromConstructor(VarTo<RecyclableObject>(newTarget), scriptContext);
        }

        Var argArray = args.Info.Count > 2 ? args[2] : undefinedValue;
        AnalysisAssert(argArray != nullptr);
        if (!(JavascriptOperators::IsObjectType(JavascriptOperators::GetTypeId(argArray))))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedArrayLike, _u("Reflect.construct"));
        }

        return JavascriptFunction::ConstructHelper(VarTo<RecyclableObject>(target), thisArg, newTarget, argArray, scriptContext);
    }